

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::GatherBase::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  void *local_18;
  GatherBase *this_local;
  
  local_18 = this;
  this_local = (GatherBase *)__return_storage_ptr__;
  (**(code **)(*this + 0xb8))();
  std::operator+(&local_78,
                 "#version 400                                       \n#extension GL_ARB_texture_cube_map_array : enable  \nin vec4 v_in_0;                                    \nflat out "
                 ,&local_98);
  std::operator+(&local_58,&local_78," v_out_0;                   \n");
  (**(code **)(*this + 0xb0))(&local_c8);
  std::operator+(&local_38,&local_58,&local_c8);
  std::operator+(__return_storage_ptr__,&local_38,
                 "void main() {                                      \n    gl_Position = vec4(0,0,0,1);                   \n    v_out_0 = test_function(v_in_0);               \n}"
                );
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 400                                       \n"
			   "#extension GL_ARB_texture_cube_map_array : enable  \n"
			   ""
			   "in vec4 v_in_0;                                    \n"
			   "flat out " +
			   Type() + " v_out_0;                   \n" + TestFunction() +
			   "void main() {                                      \n"
			   "    gl_Position = vec4(0,0,0,1);                   \n"
			   "    v_out_0 = test_function(v_in_0);               \n"
			   "}";
	}